

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Document::parseTAGDirective(Document *this)

{
  size_type sVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  char *pcVar4;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Chars_02;
  StringRef TagHandle;
  Token Tag;
  StringRef local_98;
  StringRef local_88;
  StringRef local_70;
  Token local_60;
  
  Scanner::getNext(&local_60,
                   (Scanner *)
                   (this->stream->scanner)._M_t.
                   super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                   .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  local_88.Data = local_60.Range.Data;
  local_88.Length = local_60.Range.Length;
  Chars.Length = 2;
  Chars.Data = " \t";
  sVar1 = StringRef::find_first_of(&local_88,Chars,0);
  if (local_88.Length < sVar1) {
    sVar1 = local_88.Length;
  }
  local_98.Length = local_88.Length - sVar1;
  local_98.Data = local_88.Data + sVar1;
  Chars_00.Length = 2;
  Chars_00.Data = " \t";
  sVar1 = StringRef::find_first_not_of(&local_98,Chars_00,0);
  if (local_98.Length <= sVar1) {
    sVar1 = local_98.Length;
  }
  local_88.Length = local_98.Length - sVar1;
  local_88.Data = local_98.Data + sVar1;
  Chars_01.Length = 2;
  Chars_01.Data = " \t";
  local_98.Length = StringRef::find_first_of(&local_88,Chars_01,0);
  if (local_88.Length < local_98.Length) {
    local_98.Length = local_88.Length;
  }
  local_98.Data = local_88.Data;
  local_70.Data = local_88.Data + local_98.Length;
  local_70.Length = local_88.Length - local_98.Length;
  Chars_02.Length = 2;
  Chars_02.Data = " \t";
  sVar1 = StringRef::find_first_not_of(&local_70,Chars_02,0);
  if (local_70.Length <= sVar1) {
    sVar1 = local_70.Length;
  }
  sVar3 = local_70.Length - sVar1;
  pcVar4 = local_70.Data + sVar1;
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,&local_98);
  pmVar2->Data = pcVar4;
  pmVar2->Length = sVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.Value._M_dataplus._M_p != &local_60.Value.field_2) {
    operator_delete(local_60.Value._M_dataplus._M_p,local_60.Value.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void Document::parseTAGDirective() {
  Token Tag = getNext(); // %TAG <handle> <prefix>
  StringRef T = Tag.Range;
  // Strip %TAG
  T = T.substr(T.find_first_of(" \t")).ltrim(" \t");
  std::size_t HandleEnd = T.find_first_of(" \t");
  StringRef TagHandle = T.substr(0, HandleEnd);
  StringRef TagPrefix = T.substr(HandleEnd).ltrim(" \t");
  TagMap[TagHandle] = TagPrefix;
}